

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_transcript.cc
# Opt level: O1

bool __thiscall
bssl::SSLTranscript::GetFinishedMAC
          (SSLTranscript *this,uint8_t *out,size_t *out_len,SSL_SESSION *session,bool from_server)

{
  string_view label;
  Span<const_unsigned_char> seed1;
  bool bVar1;
  EVP_MD *digest_00;
  char *pcVar2;
  Span<unsigned_char> out_00;
  Span<const_unsigned_char> secret;
  size_t digest_len;
  uint8_t digest [64];
  size_t local_b0;
  uint8_t *local_a8;
  size_t sStack_a0;
  undefined8 local_98;
  char *pcStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  uint8_t local_78 [72];
  
  bVar1 = GetHash(this,local_78,&local_b0);
  if (bVar1) {
    pcVar2 = "client finished";
    if (from_server) {
      pcVar2 = "server finished";
    }
    digest_00 = EVP_MD_CTX_get0_md(&(this->hash_).ctx_);
    local_98 = 0xf;
    sStack_a0 = local_b0;
    local_88 = 0;
    uStack_80 = 0;
    label._M_str = pcVar2;
    label._M_len = 0xf;
    seed1.size_ = local_b0;
    seed1.data_ = local_78;
    out_00.size_ = 0xc;
    out_00.data_ = out;
    secret.size_._0_1_ = (session->secret).size_;
    secret.data_ = (uchar *)&session->secret;
    secret.size_._1_7_ = 0;
    local_a8 = local_78;
    pcStack_90 = pcVar2;
    bVar1 = tls1_prf(digest_00,out_00,secret,label,seed1,(Span<const_unsigned_char>)ZEXT816(0));
    if (bVar1) {
      *out_len = 0xc;
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool SSLTranscript::GetFinishedMAC(uint8_t *out, size_t *out_len,
                                   const SSL_SESSION *session,
                                   bool from_server) const {
  uint8_t digest[EVP_MAX_MD_SIZE];
  size_t digest_len;
  if (!GetHash(digest, &digest_len)) {
    return false;
  }

  std::string_view label = from_server ? "server finished" : "client finished";
  static const size_t kFinishedLen = 12;
  if (!tls1_prf(Digest(), Span(out, kFinishedLen), session->secret, label,
                Span(digest, digest_len), {})) {
    return false;
  }

  *out_len = kFinishedLen;
  return true;
}